

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

range_pair * __thiscall
srell::regex_internal::re_character_class::charclasspos(re_character_class *this,uint no)

{
  reference prVar1;
  range_pair *pos;
  uint no_local;
  re_character_class *this_local;
  
  prVar1 = simple_array<srell::regex_internal::range_pair>::operator[]
                     (&this->char_class_pos_,(ulong)no);
  if ((uint)prVar1->second < 9) {
    this_local = (re_character_class *)
                 simple_array<srell::regex_internal::range_pair>::operator[]
                           (&this->char_class_pos_,(ulong)no);
  }
  else {
    this_local = (re_character_class *)
                 simple_array<srell::regex_internal::range_pair>::operator[]
                           (&this->char_class_pos_el_,(ulong)no);
    if (*(uchar21 *)((long)&(this_local->char_class_).rparray_.buffer_ + 4) == L'\0') {
      finalise(this,no);
    }
  }
  return (range_pair *)this_local;
}

Assistant:

const range_pair &charclasspos(const unsigned int no)	//  const
	{
		if (char_class_pos_[no].second <= lsearch_maxranges_)
			return char_class_pos_[no];
		else
		{
			const range_pair &pos = char_class_pos_el_[no];

			if (pos.second == 0)
				finalise(no);
			return pos;
		}
	}